

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O1

RtMidiOut * luaGetUserdata<RtMidiOut>(lua_State *L,int index,char *tname)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  RtMidiOut *pRVar4;
  undefined4 in_register_00000034;
  
  luaL_checktype(L,CONCAT44(in_register_00000034,index),7);
  iVar1 = lua_getmetatable(L,index);
  if (iVar1 == 0) {
    uVar2 = lua_type(L,index);
    uVar3 = lua_typename(L,uVar2);
    uVar3 = lua_pushfstring(L,"%s expected, got %s",tname,uVar3);
    luaL_argerror(L,index,uVar3);
  }
  iVar1 = lua_rawequal(L,0xffffffff,0xfffffffe);
  while (iVar1 == 0) {
    iVar1 = lua_type(L,0xffffffff);
    if (iVar1 == 5) {
      lua_pushlstring(L,"__index",7);
      lua_rawget(L,0xfffffffe);
      lua_replace(L,0xfffffffe);
      iVar1 = lua_getmetatable(L,0xffffffff);
      if (iVar1 == 0) {
        uVar2 = lua_type(L,index);
        uVar3 = lua_typename(L,uVar2);
        uVar3 = lua_pushfstring(L,"%s expected, got %s",tname,uVar3);
        luaL_argerror(L,index,uVar3);
      }
      lua_replace(L,0xfffffffe);
    }
    else {
      uVar2 = lua_type(L,index);
      uVar3 = lua_typename(L,uVar2);
      uVar3 = lua_pushfstring(L,"%s expected, got %s",tname,uVar3);
      luaL_argerror(L,index,uVar3);
    }
    iVar1 = lua_rawequal(L,0xffffffff,0xfffffffe);
  }
  lua_settop(L,0xfffffffd);
  pRVar4 = (RtMidiOut *)lua_touserdata(L,index);
  return pRVar4;
}

Assistant:

T &luaGetUserdata(lua_State *L, int index, const char *tname) {
	luaL_checktype(L, index, LUA_TUSERDATA);
	if (!lua_getmetatable(L, index))
		luaL_typerror(L, index, tname);

	while (!lua_rawequal(L, -1, -2)) {
		if (!lua_istable(L, -1))
			luaL_typerror(L, index, tname);
		else {
			// [T mt] [v.mt]
			lua_pushliteral(L, "__index");
			// [T mt] [v.mt] "__index"
			lua_rawget(L, -2);
			// [T mt] [v.mt] [v.mt].__index
			lua_replace(L, -2);
			// [T mt] [v.mt].__index
			if (!lua_getmetatable(L, -1))
				luaL_typerror(L, index, tname);
			// [T mt] [v.mt].__index getmetatable([v.mt].__index)
			lua_replace(L, -2);
			// [T mt] getmetatable([v.mt].__index)
		}
	}

	lua_pop(L, 2);
	return *reinterpret_cast<T *>(lua_touserdata(L, index));
}